

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srv_role.hxx
# Opt level: O0

string * nuraft::srv_role_to_string_abi_cxx11_(srv_role _role)

{
  int in_ESI;
  string *in_RDI;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [16];
  allocator local_d [13];
  
  if (in_ESI == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"follower",local_d);
    std::allocator<char>::~allocator((allocator<char> *)local_d);
  }
  else if (in_ESI == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"candidate",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
  }
  else if (in_ESI == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"leader",&local_1e);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"UNKNOWN",&local_1f);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f);
  }
  return in_RDI;
}

Assistant:

inline std::string ATTR_UNUSED
       srv_role_to_string(srv_role _role)
{
    switch (_role) {
    case follower:      return "follower";
    case candidate:     return "candidate";
    case leader:        return "leader";
    default:            return "UNKNOWN";
    }
    return "UNKNOWN";
}